

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O0

XMLSize_t __thiscall
xercesc_4_0::ICUTranscoder::transcodeFrom
          (ICUTranscoder *this,XMLByte *srcData,XMLSize_t srcCount,XMLCh *toFill,XMLSize_t maxChars,
          XMLSize_t *bytesEaten,uchar *charSizes)

{
  UChar UVar1;
  byte bVar2;
  MemoryManager *pMVar3;
  TranscodingException *pTVar4;
  XMLCh *text2;
  size_t __n;
  ulong in_stack_fffffffffffffed8;
  XMLUInt32 *local_d0;
  uint local_a8;
  uint index;
  uchar fillSize;
  XMLSize_t charsDecoded;
  XMLCh local_88 [4];
  XMLCh tmpBuf [17];
  int local_5c;
  XMLCh *pXStack_58;
  UErrorCode err;
  UChar *orgTarget;
  UChar *startTarget;
  XMLByte *endSrc;
  XMLByte *startSrc;
  XMLSize_t *bytesEaten_local;
  XMLSize_t maxChars_local;
  XMLCh *toFill_local;
  XMLSize_t srcCount_local;
  XMLByte *srcData_local;
  ICUTranscoder *this_local;
  
  startTarget = (UChar *)(srcData + srcCount);
  local_5c = 0;
  if ((this->fFixed & 1U) == 0) {
    local_d0 = this->fSrcOffsets;
  }
  else {
    local_d0 = (XMLUInt32 *)0x0;
  }
  pXStack_58 = toFill;
  orgTarget = toFill;
  endSrc = srcData;
  startSrc = (XMLByte *)bytesEaten;
  bytesEaten_local = (XMLSize_t *)maxChars;
  maxChars_local = (XMLSize_t)toFill;
  toFill_local = (XMLCh *)srcCount;
  srcCount_local = (XMLSize_t)srcData;
  srcData_local = (XMLByte *)this;
  ucnv_toUnicode_70(this->fConverter,&orgTarget,toFill + maxChars,&endSrc,startTarget,local_d0,
                    in_stack_fffffffffffffed8 & 0xffffffff00000000,&local_5c);
  if ((local_5c == 0) || (local_5c == 0xf)) {
    *(XMLSize_t *)startSrc = (long)endSrc - srcCount_local;
    __n = (long)orgTarget - (long)pXStack_58 >> 1;
    if ((this->fFixed & 1U) == 0) {
      if (__n == 1) {
        *charSizes = (uchar)*(undefined8 *)startSrc;
      }
      else if (__n != 0) {
        for (local_a8 = 0; (ulong)local_a8 < __n - 1; local_a8 = local_a8 + 1) {
          charSizes[local_a8] =
               (char)this->fSrcOffsets[local_a8 + 1] - (char)this->fSrcOffsets[local_a8];
        }
        charSizes[__n - 1] = (char)*(undefined8 *)startSrc - (char)this->fSrcOffsets[__n - 1];
      }
    }
    else {
      bVar2 = ucnv_getMaxCharSize_70(this->fConverter);
      memset(charSizes,(uint)bVar2,__n);
    }
    return __n;
  }
  if (pXStack_58 != (XMLCh *)maxChars_local) {
    pMVar3 = XMLTranscoder::getMemoryManager(&this->super_XMLTranscoder);
    (*pMVar3->_vptr_MemoryManager[4])(pMVar3,pXStack_58);
  }
  if ((this->fFixed & 1U) == 0) {
    pTVar4 = (TranscodingException *)__cxa_allocate_exception(0x30);
    pMVar3 = XMLTranscoder::getMemoryManager(&this->super_XMLTranscoder);
    TranscodingException::TranscodingException
              (pTVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/Transcoders/ICU/ICUTransService.cpp"
               ,0x216,Trans_BadSrcSeq,pMVar3);
    __cxa_throw(pTVar4,&TranscodingException::typeinfo,TranscodingException::~TranscodingException);
  }
  UVar1 = *orgTarget;
  pMVar3 = XMLTranscoder::getMemoryManager(&this->super_XMLTranscoder);
  XMLString::binToText((uint)(ushort)UVar1,local_88,0x10,0x10,pMVar3);
  pTVar4 = (TranscodingException *)__cxa_allocate_exception(0x30);
  text2 = XMLTranscoder::getEncodingName(&this->super_XMLTranscoder);
  pMVar3 = XMLTranscoder::getMemoryManager(&this->super_XMLTranscoder);
  TranscodingException::TranscodingException
            (pTVar4,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/Transcoders/ICU/ICUTransService.cpp"
             ,0x212,Trans_BadSrcCP,local_88,text2,(XMLCh *)0x0,(XMLCh *)0x0,pMVar3);
  __cxa_throw(pTVar4,&TranscodingException::typeinfo,TranscodingException::~TranscodingException);
}

Assistant:

XMLSize_t
ICUTranscoder::transcodeFrom(const  XMLByte* const          srcData
                            , const XMLSize_t               srcCount
                            ,       XMLCh* const            toFill
                            , const XMLSize_t               maxChars
                            ,       XMLSize_t&              bytesEaten
                            ,       unsigned char* const    charSizes)
{
    // Set up pointers to the start and end of the source buffer
    const XMLByte*  startSrc = srcData;
    const XMLByte*  endSrc = srcData + srcCount;

    //
    //  And now do the target buffer. This works differently according to
    //  whether XMLCh and UChar are the same size or not.
    //
    UChar* startTarget;
    if (sizeof(XMLCh) == sizeof(UChar))
        startTarget = (UChar*)toFill;
    else
        startTarget = (UChar*) getMemoryManager()->allocate
        (
            maxChars * sizeof(UChar)
        );//new UChar[maxChars];
    UChar* orgTarget = startTarget;

    //
    //  Transcode the buffer.  Buffer overflow errors are normal, occuring
    //  when the raw input buffer holds more characters than will fit in
    //  the Unicode output buffer.
    //
    UErrorCode  err = U_ZERO_ERROR;
    ucnv_toUnicode
    (
        fConverter
        , &startTarget
        , startTarget + maxChars
        , (const char**)&startSrc
        , (const char*)endSrc
        , (fFixed ? 0 : (int32_t*)fSrcOffsets)
        , false
        , &err
    );

    if ((err != U_ZERO_ERROR) && (err != U_BUFFER_OVERFLOW_ERROR))
    {
        if (orgTarget != (UChar*)toFill)
            getMemoryManager()->deallocate(orgTarget);//delete [] orgTarget;

        if (fFixed)
        {
            XMLCh tmpBuf[17];
            XMLString::binToText((unsigned int)(*startTarget), tmpBuf, 16, 16, getMemoryManager());
            ThrowXMLwithMemMgr2
            (
                TranscodingException
                , XMLExcepts::Trans_BadSrcCP
                , tmpBuf
                , getEncodingName()
                , getMemoryManager()
            );
        }
        else
        {
            ThrowXMLwithMemMgr(TranscodingException, XMLExcepts::Trans_BadSrcSeq, getMemoryManager());
        }
    }

    // Calculate the bytes eaten and store in caller's param
    bytesEaten = startSrc - srcData;

    // And the characters decoded
    const XMLSize_t charsDecoded = startTarget - orgTarget;

    //
    //  Translate the array of char offsets into an array of character
    //  sizes, which is what the transcoder interface semantics requires.
    //  If its fixed, then we can optimize it.
    //
    if (fFixed)
    {
        const unsigned char fillSize = (unsigned char)ucnv_getMaxCharSize(fConverter);
        memset(charSizes, fillSize, charsDecoded);
    }
    else
    {
        //
        //  We have to convert the series of offsets into a series of
        //  sizes. If just one char was decoded, then its the total bytes
        //  eaten. Otherwise, do a loop and subtract out each element from
        //  its previous element.
        //
        if (charsDecoded == 1)
        {
            charSizes[0] = (unsigned char)bytesEaten;
        }
        else if( charsDecoded > 0 )
        {
            //  ICU does not return an extra element to allow us to figure
            //  out the last char size, so we have to compute it from the
            //  total bytes used.
            unsigned int index;
            for (index = 0; index < charsDecoded - 1; index++)
            {
                charSizes[index] = (unsigned char)(fSrcOffsets[index + 1]
                                                    - fSrcOffsets[index]);
            }

            charSizes[charsDecoded - 1] = (unsigned char)(bytesEaten
                                          - fSrcOffsets[charsDecoded - 1]);
        }
    }

    //
    //  If XMLCh and UChar are not the same size, then we need to copy over
    //  the temp buffer to the new one.
    //
    if (sizeof(UChar) != sizeof(XMLCh))
    {
        XMLCh* outPtr = toFill;
        startTarget = orgTarget;
        for (unsigned int index = 0; index < charsDecoded; index++)
            *outPtr++ = XMLCh(*startTarget++);

        // And delete the temp buffer
        getMemoryManager()->deallocate(orgTarget);//delete [] orgTarget;
    }

    // Return the chars we put into the target buffer
    return charsDecoded;
}